

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading_atomic_ref_count.h
# Opt level: O0

int threading_atomic_ref_count_decrement(threading_atomic_ref_count ref)

{
  bool bVar1;
  uintmax_t old_ref_count;
  threading_atomic_ref_count ref_local;
  uint local_4;
  
  bVar1 = ref->count != 0;
  if (bVar1) {
    LOCK();
    ref->count = ref->count - 1;
    UNLOCK();
  }
  local_4 = (uint)!bVar1;
  return local_4;
}

Assistant:

static inline int threading_atomic_ref_count_decrement(threading_atomic_ref_count ref)
{
#if defined(__THREAD_SANITIZER__)
	threading_mutex_lock(&ref->m);
	{
		--ref->count;
	}
	threading_mutex_unlock(&ref->m);
#else
	if (atomic_load_explicit(&ref->count, memory_order_relaxed) == THREADING_ATOMIC_REF_COUNT_MIN)
	{
		return 1;
	}

	uintmax_t old_ref_count = atomic_fetch_sub_explicit(&ref->count, 1, memory_order_release);

	if (old_ref_count == THREADING_ATOMIC_REF_COUNT_MIN + 1)
	{
		atomic_thread_fence(memory_order_acquire);
	}
#endif

	return 0;
}